

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Json.h
# Opt level: O1

void __thiscall
nlohmann::detail::
serializer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
::dump(serializer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
       *this,basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
             *val,bool pretty_print,bool ensure_ascii,uint indent_step,uint current_indent)

{
  _func_int **pp_Var1;
  _Rb_tree_node_base *p_Var2;
  _Base_ptr p_Var3;
  _func_int *UNRECOVERED_JUMPTABLE_00;
  undefined8 uVar4;
  char *pcVar5;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  *val_00;
  element_type *peVar6;
  uint uVar7;
  ulong uVar9;
  pointer pbVar10;
  ulong uVar8;
  
  if (discarded < val->m_type) {
    return;
  }
  switch(val->m_type) {
  case null:
    peVar6 = (this->o).
             super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    UNRECOVERED_JUMPTABLE_00 = peVar6->_vptr_output_adapter_protocol[1];
    pcVar5 = "null";
    break;
  case object:
    peVar6 = (this->o).
             super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    pp_Var1 = peVar6->_vptr_output_adapter_protocol;
    if ((((val->m_value).object)->_M_t)._M_impl.super__Rb_tree_header._M_node_count != 0) {
      if (pretty_print) {
        (*pp_Var1[1])(peVar6,"{\n",2);
        uVar7 = indent_step + current_indent;
        uVar8 = (ulong)uVar7;
        uVar9 = (this->indent_string)._M_string_length;
        if (uVar9 < uVar8) {
          std::__cxx11::string::resize((ulong)&this->indent_string,(char)uVar9 * '\x02');
        }
        p_Var2 = (((val->m_value).object)->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
        if ((((val->m_value).object)->_M_t)._M_impl.super__Rb_tree_header._M_node_count != 1) {
          uVar9 = 0;
          do {
            peVar6 = (this->o).
                     super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr;
            (*peVar6->_vptr_output_adapter_protocol[1])
                      (peVar6,(this->indent_string)._M_dataplus._M_p,uVar8);
            peVar6 = (this->o).
                     super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr;
            (**peVar6->_vptr_output_adapter_protocol)(peVar6,0x22);
            dump_escaped(this,(string_t *)(p_Var2 + 1),ensure_ascii);
            peVar6 = (this->o).
                     super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr;
            (*peVar6->_vptr_output_adapter_protocol[1])(peVar6,"\": ",3);
            dump(this,(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                       *)(p_Var2 + 2),true,ensure_ascii,indent_step,uVar7);
            peVar6 = (this->o).
                     super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr;
            (*peVar6->_vptr_output_adapter_protocol[1])(peVar6,",\n",2);
            uVar9 = uVar9 + 1;
            p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2);
          } while (uVar9 < (((val->m_value).object)->_M_t)._M_impl.super__Rb_tree_header.
                           _M_node_count - 1);
        }
        peVar6 = (this->o).
                 super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
        (*peVar6->_vptr_output_adapter_protocol[1])
                  (peVar6,(this->indent_string)._M_dataplus._M_p,uVar8);
        peVar6 = (this->o).
                 super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
        (**peVar6->_vptr_output_adapter_protocol)(peVar6,0x22);
        dump_escaped(this,(string_t *)(p_Var2 + 1),ensure_ascii);
        peVar6 = (this->o).
                 super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
        (*peVar6->_vptr_output_adapter_protocol[1])(peVar6,"\": ",3);
        dump(this,(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                   *)(p_Var2 + 2),true,ensure_ascii,indent_step,uVar7);
        peVar6 = (this->o).
                 super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
        (**peVar6->_vptr_output_adapter_protocol)(peVar6,10);
        peVar6 = (this->o).
                 super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
        (*peVar6->_vptr_output_adapter_protocol[1])
                  (peVar6,(this->indent_string)._M_dataplus._M_p,(ulong)current_indent);
      }
      else {
        (**pp_Var1)(peVar6,0x7b);
        p_Var3 = (((val->m_value).object)->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
        if ((((val->m_value).object)->_M_t)._M_impl.super__Rb_tree_header._M_node_count != 1) {
          uVar9 = 0;
          do {
            peVar6 = (this->o).
                     super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr;
            (**peVar6->_vptr_output_adapter_protocol)(peVar6,0x22);
            dump_escaped(this,(string_t *)(p_Var3 + 1),ensure_ascii);
            peVar6 = (this->o).
                     super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr;
            (*peVar6->_vptr_output_adapter_protocol[1])(peVar6,"\":",2);
            dump(this,(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                       *)(p_Var3 + 2),false,ensure_ascii,indent_step,current_indent);
            peVar6 = (this->o).
                     super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr;
            (**peVar6->_vptr_output_adapter_protocol)(peVar6,0x2c);
            uVar9 = uVar9 + 1;
            p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
          } while (uVar9 < (((val->m_value).object)->_M_t)._M_impl.super__Rb_tree_header.
                           _M_node_count - 1);
        }
        peVar6 = (this->o).
                 super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
        (**peVar6->_vptr_output_adapter_protocol)(peVar6,0x22);
        dump_escaped(this,(string_t *)(p_Var3 + 1),ensure_ascii);
        peVar6 = (this->o).
                 super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
        (*peVar6->_vptr_output_adapter_protocol[1])(peVar6,"\":",2);
        dump(this,(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                   *)(p_Var3 + 2),false,ensure_ascii,indent_step,current_indent);
      }
      peVar6 = (this->o).
               super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      UNRECOVERED_JUMPTABLE_00 = *peVar6->_vptr_output_adapter_protocol;
      uVar4 = 0x7d;
      goto LAB_0015335d;
    }
    UNRECOVERED_JUMPTABLE_00 = pp_Var1[1];
    pcVar5 = "{}";
    goto LAB_001531d7;
  case array:
    peVar6 = (this->o).
             super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    pp_Var1 = peVar6->_vptr_output_adapter_protocol;
    if ((((val->m_value).array)->
        super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
        )._M_impl.super__Vector_impl_data._M_start !=
        (((val->m_value).array)->
        super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
        )._M_impl.super__Vector_impl_data._M_finish) {
      if (pretty_print) {
        (*pp_Var1[1])(peVar6,"[\n",2);
        uVar7 = current_indent + indent_step;
        uVar8 = (ulong)uVar7;
        uVar9 = (this->indent_string)._M_string_length;
        if (uVar9 < uVar8) {
          std::__cxx11::string::resize((ulong)&this->indent_string,(char)uVar9 * '\x02');
        }
        pbVar10 = (((val->m_value).array)->
                  super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        if (pbVar10 !=
            (((val->m_value).array)->
            super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
            )._M_impl.super__Vector_impl_data._M_finish + -1) {
          do {
            peVar6 = (this->o).
                     super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr;
            (*peVar6->_vptr_output_adapter_protocol[1])
                      (peVar6,(this->indent_string)._M_dataplus._M_p,uVar8);
            dump(this,pbVar10,true,ensure_ascii,indent_step,uVar7);
            peVar6 = (this->o).
                     super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr;
            (*peVar6->_vptr_output_adapter_protocol[1])(peVar6,",\n",2);
            pbVar10 = pbVar10 + 1;
          } while (pbVar10 !=
                   (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                    *)(((val->m_value).string)->_M_string_length - 0x10));
        }
        peVar6 = (this->o).
                 super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
        (*peVar6->_vptr_output_adapter_protocol[1])
                  (peVar6,(this->indent_string)._M_dataplus._M_p,uVar8);
        dump(this,(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                   *)(((val->m_value).string)->_M_string_length - 0x10),true,ensure_ascii,
             indent_step,uVar7);
        peVar6 = (this->o).
                 super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
        (**peVar6->_vptr_output_adapter_protocol)(peVar6,10);
        peVar6 = (this->o).
                 super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
        (*peVar6->_vptr_output_adapter_protocol[1])
                  (peVar6,(this->indent_string)._M_dataplus._M_p,(ulong)current_indent);
      }
      else {
        (**pp_Var1)(peVar6,0x5b);
        pbVar10 = (((val->m_value).array)->
                  super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        val_00 = (((val->m_value).array)->
                 super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish + -1;
        if (pbVar10 != val_00) {
          do {
            dump(this,pbVar10,false,ensure_ascii,indent_step,current_indent);
            peVar6 = (this->o).
                     super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr;
            (**peVar6->_vptr_output_adapter_protocol)(peVar6,0x2c);
            pbVar10 = pbVar10 + 1;
            val_00 = (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      *)(((val->m_value).string)->_M_string_length - 0x10);
          } while (pbVar10 != val_00);
        }
        dump(this,val_00,false,ensure_ascii,indent_step,current_indent);
      }
      peVar6 = (this->o).
               super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      UNRECOVERED_JUMPTABLE_00 = *peVar6->_vptr_output_adapter_protocol;
      uVar4 = 0x5d;
      goto LAB_0015335d;
    }
    UNRECOVERED_JUMPTABLE_00 = pp_Var1[1];
    pcVar5 = "[]";
LAB_001531d7:
    uVar4 = 2;
    goto LAB_001531dc;
  case string:
    peVar6 = (this->o).
             super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    (**peVar6->_vptr_output_adapter_protocol)(peVar6,0x22);
    dump_escaped(this,(string_t *)(val->m_value).object,ensure_ascii);
    peVar6 = (this->o).
             super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    UNRECOVERED_JUMPTABLE_00 = *peVar6->_vptr_output_adapter_protocol;
    uVar4 = 0x22;
LAB_0015335d:
    (*UNRECOVERED_JUMPTABLE_00)(peVar6,uVar4);
    return;
  case boolean:
    peVar6 = (this->o).
             super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    UNRECOVERED_JUMPTABLE_00 = peVar6->_vptr_output_adapter_protocol[1];
    if ((val->m_value).boolean != true) {
      pcVar5 = "false";
      uVar4 = 5;
      goto LAB_001531dc;
    }
    pcVar5 = "true";
    break;
  case number_integer:
    dump_integer<long,_0>(this,(val->m_value).number_integer);
    return;
  case number_unsigned:
    dump_integer<unsigned_long,_0>(this,(val->m_value).number_unsigned);
    return;
  case number_float:
    dump_float(this,(val->m_value).number_float);
    return;
  case discarded:
    peVar6 = (this->o).
             super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    UNRECOVERED_JUMPTABLE_00 = peVar6->_vptr_output_adapter_protocol[1];
    pcVar5 = "<discarded>";
    uVar4 = 0xb;
    goto LAB_001531dc;
  }
  uVar4 = 4;
LAB_001531dc:
  (*UNRECOVERED_JUMPTABLE_00)(peVar6,pcVar5,uVar4);
  return;
}

Assistant:

void dump(const BasicJsonType& val, const bool pretty_print,
const bool ensure_ascii,
const unsigned int indent_step,
const unsigned int current_indent = 0)
{
switch (val.m_type)
{
case value_t::object:
{
if (val.m_value.object->empty())
{
o->write_characters("{}", 2);
return;
}

if (pretty_print)
{
o->write_characters("{\n", 2);

// variable to hold indentation for recursive calls
const auto new_indent = current_indent + indent_step;
if (JSON_UNLIKELY(indent_string.size() < new_indent))
{
indent_string.resize(indent_string.size() * 2, ' ');
}

// first n-1 elements
auto i = val.m_value.object->cbegin();
for (std::size_t cnt = 0; cnt < val.m_value.object->size() - 1; ++cnt, ++i)
{
o->write_characters(indent_string.c_str(), new_indent);
o->write_character('\"');
dump_escaped(i->first, ensure_ascii);
o->write_characters("\": ", 3);
dump(i->second, true, ensure_ascii, indent_step, new_indent);
o->write_characters(",\n", 2);
}

// last element
assert(i != val.m_value.object->cend());
assert(std::next(i) == val.m_value.object->cend());
o->write_characters(indent_string.c_str(), new_indent);
o->write_character('\"');
dump_escaped(i->first, ensure_ascii);
o->write_characters("\": ", 3);
dump(i->second, true, ensure_ascii, indent_step, new_indent);

o->write_character('\n');
o->write_characters(indent_string.c_str(), current_indent);
o->write_character('}');
}
else
{
o->write_character('{');

// first n-1 elements
auto i = val.m_value.object->cbegin();
for (std::size_t cnt = 0; cnt < val.m_value.object->size() - 1; ++cnt, ++i)
{
o->write_character('\"');
dump_escaped(i->first, ensure_ascii);
o->write_characters("\":", 2);
dump(i->second, false, ensure_ascii, indent_step, current_indent);
o->write_character(',');
}

// last element
assert(i != val.m_value.object->cend());
assert(std::next(i) == val.m_value.object->cend());
o->write_character('\"');
dump_escaped(i->first, ensure_ascii);
o->write_characters("\":", 2);
dump(i->second, false, ensure_ascii, indent_step, current_indent);

o->write_character('}');
}

return;
}

case value_t::array:
{
if (val.m_value.array->empty())
{
o->write_characters("[]", 2);
return;
}

if (pretty_print)
{
o->write_characters("[\n", 2);

// variable to hold indentation for recursive calls
const auto new_indent = current_indent + indent_step;
if (JSON_UNLIKELY(indent_string.size() < new_indent))
{
indent_string.resize(indent_string.size() * 2, ' ');
}

// first n-1 elements
for (auto i = val.m_value.array->cbegin();
i != val.m_value.array->cend() - 1; ++i)
{
o->write_characters(indent_string.c_str(), new_indent);
dump(*i, true, ensure_ascii, indent_step, new_indent);
o->write_characters(",\n", 2);
}

// last element
assert(not val.m_value.array->empty());
o->write_characters(indent_string.c_str(), new_indent);
dump(val.m_value.array->back(), true, ensure_ascii, indent_step, new_indent);

o->write_character('\n');
o->write_characters(indent_string.c_str(), current_indent);
o->write_character(']');
}
else
{
o->write_character('[');

// first n-1 elements
for (auto i = val.m_value.array->cbegin();
i != val.m_value.array->cend() - 1; ++i)
{
dump(*i, false, ensure_ascii, indent_step, current_indent);
o->write_character(',');
}

// last element
assert(not val.m_value.array->empty());
dump(val.m_value.array->back(), false, ensure_ascii, indent_step, current_indent);

o->write_character(']');
}

return;
}

case value_t::string:
{
o->write_character('\"');
dump_escaped(*val.m_value.string, ensure_ascii);
o->write_character('\"');
return;
}

case value_t::boolean:
{
if (val.m_value.boolean)
{
o->write_characters("true", 4);
}
else
{
o->write_characters("false", 5);
}
return;
}

case value_t::number_integer:
{
dump_integer(val.m_value.number_integer);
return;
}

case value_t::number_unsigned:
{
dump_integer(val.m_value.number_unsigned);
return;
}

case value_t::number_float:
{
dump_float(val.m_value.number_float);
return;
}

case value_t::discarded:
{
o->write_characters("<discarded>", 11);
return;
}

case value_t::null:
{
o->write_characters("null", 4);
return;
}
}
}